

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh.cxx
# Opt level: O0

void __thiscall level_mesh::create_models(level_mesh *this)

{
  pointer *this_00;
  pointer *this_01;
  bool bVar1;
  size_type sVar2;
  size_type num_mu_instances_00;
  size_t sVar3;
  size_type sVar4;
  reference ppbVar5;
  vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_> local_a8;
  __normal_iterator<b_model_instance_**,_std::vector<b_model_instance_*,_std::allocator<b_model_instance_*>_>_>
  local_88;
  b_model_instance_vec_it end;
  b_model_instance_vec_it it;
  undefined1 local_68 [8];
  b_submesh_vec submeshes;
  b_submesh_vec fake_submeshes;
  b_submesh_vec mu_submeshes;
  size_t num_mu_instances;
  size_t num_models_hint;
  level_mesh *this_local;
  
  sVar2 = std::vector<b_model,_std::allocator<b_model>_>::size(&this->m_models);
  num_mu_instances_00 =
       std::vector<b_mu_instance,_std::allocator<b_mu_instance>_>::size(&this->m_mu_instances);
  xray_re::msg("building edge-connected submeshes");
  this_00 = &fake_submeshes.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>::vector
            ((vector<b_submesh_*,_std::allocator<b_submesh_*>_> *)this_00);
  this_01 = &submeshes.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>::vector
            ((vector<b_submesh_*,_std::allocator<b_submesh_*>_> *)this_01);
  std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>::vector
            ((vector<b_submesh_*,_std::allocator<b_submesh_*>_> *)local_68);
  sVar3 = create_submeshes(this,(b_submesh_vec *)this_00,(b_submesh_vec *)this_01,
                           (vector<b_submesh_*,_std::allocator<b_submesh_*>_> *)local_68);
  sVar4 = std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>::size
                    ((vector<b_submesh_*,_std::allocator<b_submesh_*>_> *)
                     &fake_submeshes.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  xray_re::msg("submeshes (MU): %Iu",sVar4);
  sVar4 = std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>::size
                    ((vector<b_submesh_*,_std::allocator<b_submesh_*>_> *)
                     &submeshes.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  xray_re::msg("submeshes (fake): %Iu",sVar4);
  sVar4 = std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>::size
                    ((vector<b_submesh_*,_std::allocator<b_submesh_*>_> *)local_68);
  xray_re::msg("submeshes (regular): %Iu",sVar4);
  xray_re::msg("reordering faces");
  reorder_faces(this);
  xray_re::msg("accounting submeshes");
  account_submeshes(this,(b_submesh_vec *)
                         &fake_submeshes.
                          super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,
                    (b_submesh_vec *)
                    &submeshes.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage,(b_submesh_vec *)local_68);
  xray_re::msg("creating collision models (MU)");
  setup_collision_models
            (this,(b_submesh_vec *)
                  &fake_submeshes.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  xray_re::msg("creating collision models (fake)");
  setup_collision_models
            (this,(b_submesh_vec *)
                  &submeshes.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  merge_mu_fake_submeshes
            (this,(b_submesh_vec *)
                  &fake_submeshes.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,
             (b_submesh_vec *)
             &submeshes.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(b_submesh_vec *)local_68);
  xray_re::msg("creating collision models (regular)");
  setup_collision_models(this,(b_submesh_vec *)local_68);
  merge_regular_submeshes(this,(b_submesh_vec *)local_68,sVar2 + sVar3);
  if ((this->m_debug_merge & 1U) != 0) {
    end._M_current =
         (b_model_instance **)
         std::vector<b_model_instance_*,_std::allocator<b_model_instance_*>_>::begin
                   (&this->m_instances);
    local_88._M_current =
         (b_model_instance **)
         std::vector<b_model_instance_*,_std::allocator<b_model_instance_*>_>::end
                   (&this->m_instances);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&end,&local_88);
      if (!bVar1) break;
      ppbVar5 = __gnu_cxx::
                __normal_iterator<b_model_instance_**,_std::vector<b_model_instance_*,_std::allocator<b_model_instance_*>_>_>
                ::operator*(&end);
      xray_re::_aabb<float>::grow(&(*ppbVar5)->aabb,this->m_glue_factor);
      __gnu_cxx::
      __normal_iterator<b_model_instance_**,_std::vector<b_model_instance_*,_std::allocator<b_model_instance_*>_>_>
      ::operator++(&end);
    }
    std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::swap
              (&(this->super_xr_mesh_builder).super_xr_mesh.m_points,&this->m_fat_points);
  }
  local_a8.super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::vector
            (&local_a8);
  std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::swap
            (&local_a8,&this->m_fat_points);
  std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::~vector
            (&local_a8);
  validate_instances_order(this);
  pre_commit(this);
  collect_mu_models(this,num_mu_instances_00);
  lock_models(this);
  std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>::~vector
            ((vector<b_submesh_*,_std::allocator<b_submesh_*>_> *)local_68);
  std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>::~vector
            ((vector<b_submesh_*,_std::allocator<b_submesh_*>_> *)
             &submeshes.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<b_submesh_*,_std::allocator<b_submesh_*>_>::~vector
            ((vector<b_submesh_*,_std::allocator<b_submesh_*>_> *)
             &fake_submeshes.super__Vector_base<b_submesh_*,_std::allocator<b_submesh_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void level_mesh::create_models()
{
	size_t num_models_hint = m_models.size(), num_mu_instances = m_mu_instances.size();

	msg("building edge-connected submeshes");
	b_submesh_vec mu_submeshes, fake_submeshes, submeshes;
	num_models_hint += create_submeshes(mu_submeshes, fake_submeshes, submeshes);
	msg("submeshes (MU): %" PRIuSIZET, mu_submeshes.size());
	msg("submeshes (fake): %" PRIuSIZET, fake_submeshes.size());
	msg("submeshes (regular): %" PRIuSIZET, submeshes.size());

	msg("reordering faces");
	reorder_faces();

	msg("accounting submeshes");
	account_submeshes(mu_submeshes, fake_submeshes, submeshes);

#ifdef USE_WIN32_MT
	HANDLE setup_thread = NULL;
	if (m_use_mt) {
		msg("creating collision models (regular) - starting thread");
		setup_thread_param param;
		param.__this = this;
		param.submeshes = &submeshes;
		setup_thread = (HANDLE)_beginthreadex(NULL, 0, &level_mesh::setup_thread_cb, &param, 0, NULL);
		xr_assert(setup_thread != NULL);
	}
#endif
	msg("creating collision models (MU)");
	setup_collision_models(mu_submeshes);
	msg("creating collision models (fake)");
	setup_collision_models(fake_submeshes);

#ifdef USE_WIN32_MT
	if (setup_thread != NULL) {
		b_submesh_vec temp_submeshes;
		merge_mu_fake_submeshes(mu_submeshes, fake_submeshes, temp_submeshes);
		msg("creating collision models (regular) - waiting thread");
		WaitForSingleObject(setup_thread, INFINITE);
		submeshes.insert(submeshes.end(), temp_submeshes.begin(), temp_submeshes.end());
	} else
#endif
	{
		merge_mu_fake_submeshes(mu_submeshes, fake_submeshes, submeshes);
		msg("creating collision models (regular)");
		setup_collision_models(submeshes);
	}
	merge_regular_submeshes(submeshes, num_models_hint);

	if (m_debug_merge) {
		for (b_model_instance_vec_it it = m_instances.begin(),
				end = m_instances.end(); it != end; ++it) {
			(*it)->aabb.grow(m_glue_factor);
		}
		m_points.swap(m_fat_points);
	}
	std::vector<fvector3>().swap(m_fat_points);

	validate_instances_order();

	pre_commit();

	collect_mu_models(num_mu_instances);

	lock_models();
}